

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O1

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint64_t *encbytes;
  Classifier *pCVar1;
  ChannelData *pCVar2;
  undefined1 auVar3 [16];
  uint8_t uVar4;
  CompressorScheme CVar5;
  undefined8 *__s;
  undefined8 *puVar6;
  char *pcVar7;
  ChannelData *pCVar8;
  CscChannelSet *pCVar9;
  exr_coding_channel_info_t *peVar10;
  uint8_t *puVar11;
  exr_const_context_t_conflict p_Var12;
  void *in;
  exr_result_t eVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  size_t sVar18;
  ulong uVar19;
  size_t sVar20;
  uint64_t uVar21;
  size_t sVar22;
  ulong uVar23;
  unsigned_short *toNonlinear;
  exr_encode_pipeline_t *peVar24;
  long lVar25;
  uint8_t *puVar26;
  char *__s1;
  long lVar27;
  long lVar28;
  DctCoderChannelData *dcd;
  undefined8 *__dest;
  undefined8 *out;
  int iVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  size_t outBufferSize;
  LossyDctEncoder enc;
  ulong local_3e0;
  ulong local_3c8;
  uint8_t *local_3c0;
  uint8_t *local_3b8;
  size_t local_388;
  LossyDctEncoder local_380;
  
  local_388 = 0;
  me->_channelRules = sDefaultChannelRules;
  me->_channelRuleCount = 0xf;
  DwaCompressor_initializeBuffers(me,&local_388);
  sVar22 = local_388;
  peVar24 = me->_encode;
  if (0x57 < peVar24->compressed_alloc_size) {
    eVar13 = internal_encode_alloc_buffer
                       (peVar24,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar24->compressed_buffer,
                        &peVar24->compressed_alloc_size,local_388);
    if (eVar13 != 0) {
      return eVar13;
    }
    __s = (undefined8 *)me->_encode->compressed_buffer;
    bVar31 = false;
    memset(__s,0,me->_encode->compressed_alloc_size);
    out = __s + 0xb;
    local_3c8 = 0x58;
    if (1 < sVar22) {
      __dest = (undefined8 *)((long)__s + 0x5a);
      bVar31 = me->_channelRuleCount == 0;
      bVar30 = !bVar31;
      if (bVar31) {
        local_3c0 = (uint8_t *)0x2;
      }
      else {
        local_3c0 = (uint8_t *)0x2;
        bVar30 = true;
        uVar23 = 0;
        do {
          if (me->_numChannels < 1) {
            bVar31 = true;
          }
          else {
            lVar28 = 0x1c0;
            local_3e0 = uVar23 * 3;
            lVar25 = 0;
            do {
              puVar6 = *(undefined8 **)((long)(me->_channelData->_dctData)._dctData + lVar28);
              pcVar7 = (char *)*puVar6;
              pcVar17 = strrchr(pcVar7,0x2e);
              __s1 = pcVar17 + 1;
              if (pcVar17 == (char *)0x0) {
                __s1 = pcVar7;
              }
              pCVar1 = me->_channelRules + uVar23;
              iVar29 = 0;
              bVar31 = false;
              if (pCVar1->_type == (uint)*(ushort *)((long)puVar6 + 0x1a)) {
                if (pCVar1->_caseInsensitive == 0) {
                  iVar14 = strcmp(__s1,pCVar1->_suffix);
                }
                else {
                  iVar14 = strcasecmp(__s1,pCVar1->_suffix);
                }
                bVar31 = iVar14 == 0;
              }
              if (bVar31) {
                pcVar7 = pCVar1->_suffix;
                sVar18 = strlen(pcVar7);
                uVar19 = (long)local_3c0 + sVar18 + 3;
                if (sVar22 < uVar19) {
                  iVar29 = 1;
                }
                else {
                  memcpy(__dest,pcVar7,sVar18 + 1);
                  *(byte *)((long)__dest + sVar18 + 1) =
                       ((byte)pCVar1->_caseInsensitive & 1 |
                       (char)(pCVar1->_cscIdx << 4) + ((byte)pCVar1->_scheme & 3) * '\x04') + 0x10;
                  *(char *)((long)__dest + sVar18 + 2) = (char)pCVar1->_type;
                  __dest = (undefined8 *)((long)__dest + sVar18 + 3);
                  iVar29 = 5;
                  local_3c0 = (uint8_t *)uVar19;
                }
              }
              if (bVar31) goto LAB_001080d6;
              lVar25 = lVar25 + 1;
              lVar28 = lVar28 + 0x240;
            } while (lVar25 < me->_numChannels);
            iVar29 = 5;
LAB_001080d6:
            bVar31 = iVar29 == 5;
          }
          if (!bVar31) break;
          uVar23 = uVar23 + 1;
          bVar30 = uVar23 < me->_channelRuleCount;
        } while (bVar30);
      }
      bVar31 = false;
      if ((!bVar30) && (local_3c0 < 0x10000)) {
        *(short *)out = (short)local_3c0;
        local_3c8 = (long)local_3c0 + 0x58;
        bVar31 = true;
        out = __dest;
      }
    }
    if (bVar31) {
      if (me->_encode->compressed_alloc_size <= local_3c8) {
        return 1;
      }
      local_3c0 = me->_packedAcBuffer;
      local_3b8 = me->_packedDcBuffer;
      *__s = 2;
      __s[10] = (ulong)me->_acCompression;
      DwaCompressor_setupChannelData(me);
      auVar3 = _DAT_001360e0;
      iVar29 = me->_numChannels;
      if (0 < (long)iVar29) {
        pCVar8 = me->_channelData;
        lVar25 = (long)iVar29 + -1;
        auVar32._8_4_ = (int)lVar25;
        auVar32._0_8_ = lVar25;
        auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
        lVar25 = 0;
        auVar32 = auVar32 ^ _DAT_001360e0;
        auVar33 = _DAT_001360b0;
        auVar34 = _DAT_001360c0;
        do {
          auVar35 = auVar34 ^ auVar3;
          iVar14 = auVar32._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar14 && auVar32._0_4_ < auVar35._0_4_ ||
                      iVar14 < auVar35._4_4_) & 1)) {
            puVar26 = pCVar8->_pad + lVar25 + -0xc;
            puVar26[0] = '\0';
            puVar26[1] = '\0';
            puVar26[2] = '\0';
            puVar26[3] = '\0';
          }
          if ((auVar35._12_4_ != auVar32._12_4_ || auVar35._8_4_ <= auVar32._8_4_) &&
              auVar35._12_4_ <= auVar32._12_4_) {
            puVar26 = pCVar8[1]._pad + lVar25 + -0xc;
            puVar26[0] = '\0';
            puVar26[1] = '\0';
            puVar26[2] = '\0';
            puVar26[3] = '\0';
          }
          auVar35 = auVar33 ^ auVar3;
          iVar36 = auVar35._4_4_;
          if (iVar36 <= iVar14 && (iVar36 != iVar14 || auVar35._0_4_ <= auVar32._0_4_)) {
            puVar26 = pCVar8[2]._pad + lVar25 + -0xc;
            puVar26[0] = '\0';
            puVar26[1] = '\0';
            puVar26[2] = '\0';
            puVar26[3] = '\0';
            puVar26 = pCVar8[3]._pad + lVar25 + -0xc;
            puVar26[0] = '\0';
            puVar26[1] = '\0';
            puVar26[2] = '\0';
            puVar26[3] = '\0';
          }
          lVar28 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 4;
          auVar34._8_8_ = lVar28 + 4;
          lVar28 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + 4;
          auVar33._8_8_ = lVar28 + 4;
          lVar25 = lVar25 + 0x900;
        } while ((ulong)(iVar29 + 3U >> 2) * 0x900 != lVar25);
      }
      iVar29 = me->_min[1];
      bVar31 = me->_max[1] < iVar29;
      if (me->_max[1] < iVar29) {
        uVar15 = 0;
      }
      else {
        puVar26 = (uint8_t *)me->_encode->packed_buffer;
        uVar15 = 0;
        do {
          bVar30 = 0 < me->_numChannels;
          if (0 < me->_numChannels) {
            lVar25 = 0;
            lVar28 = 0;
            do {
              lVar27 = *(long *)((long)me->_channelData->planarUncRle + lVar25 + -0x18);
              iVar14 = 10;
              if (iVar29 % *(int *)(lVar27 + 0x14) == 0) {
                uVar15 = DctCoderChannelData_push_row
                                   (me->alloc_fn,me->free_fn,
                                    (DctCoderChannelData *)
                                    ((long)(me->_channelData->_dctData)._dctData + lVar25),puVar26);
                if (uVar15 == 0) {
                  puVar26 = puVar26 + (long)*(char *)(lVar27 + 0x19) * (long)*(int *)(lVar27 + 0xc);
                  iVar14 = 0;
                  uVar15 = 0;
                }
                else {
                  iVar14 = 1;
                  local_3e0 = (ulong)uVar15;
                }
              }
              if ((iVar14 != 10) && (iVar14 != 0)) break;
              lVar28 = lVar28 + 1;
              lVar25 = lVar25 + 0x240;
              bVar30 = lVar28 < me->_numChannels;
            } while (lVar28 < me->_numChannels);
          }
          if (bVar30) break;
          bVar31 = me->_max[1] <= iVar29;
          bVar30 = iVar29 < me->_max[1];
          iVar29 = iVar29 + 1;
        } while (bVar30);
      }
      if (!bVar31) {
        return (uint)local_3e0;
      }
      bVar31 = 0 < me->_numCscChannelSets;
      if (0 < me->_numCscChannelSets) {
        lVar28 = 8;
        lVar25 = 0;
        do {
          pCVar8 = me->_channelData;
          pCVar9 = me->_cscChannelSets;
          iVar29 = *(int *)((long)pCVar9->idx + lVar28 + -8);
          iVar14 = *(int *)((long)pCVar9->idx + lVar28 + -4);
          iVar36 = *(int *)((long)pCVar9->idx + lVar28);
          LossyDctEncoder_base_construct
                    (&local_380,me->_dwaCompressionLevel / 100000.0,local_3c0,local_3b8,
                     dwaCompressorToNonlinear,(pCVar8[iVar29].chan)->width,
                     (pCVar8[iVar29].chan)->height);
          local_380._channel_encode_data_count = 3;
          local_380._channel_encode_data[0] = &pCVar8[iVar29]._dctData;
          local_380._channel_encode_data[1] = &pCVar8[iVar14]._dctData;
          local_380._channel_encode_data[2] = &pCVar8[iVar36]._dctData;
          uVar15 = LossyDctEncoder_execute(me->alloc_fn,me->free_fn,&local_380);
          auVar3 = *(undefined1 (*) [16])(__s + 8);
          __s[8] = local_380._numAcComp + auVar3._0_8_;
          __s[9] = local_380._numDcComp + auVar3._8_8_;
          local_3c0 = local_3c0 + local_380._numAcComp * 2;
          local_3b8 = local_3b8 + local_380._numDcComp * 2;
          pCVar8 = me->_channelData;
          pCVar8[*(int *)((long)pCVar9->idx + lVar28 + -8)].processed = 1;
          pCVar8[*(int *)((long)pCVar9->idx + lVar28 + -4)].processed = 1;
          pCVar8[*(int *)((long)pCVar9->idx + lVar28)].processed = 1;
          if (uVar15 != 0) {
            local_3e0._0_4_ = 1;
          }
          local_3e0 = (ulong)(uint)local_3e0;
          if (uVar15 != 0) break;
          lVar25 = lVar25 + 1;
          lVar28 = lVar28 + 0xc;
          bVar31 = lVar25 < me->_numCscChannelSets;
        } while (lVar25 < me->_numCscChannelSets);
      }
      if (bVar31) {
        return (uint)local_3e0;
      }
      bVar31 = 0 < me->_numChannels;
      if (0 < me->_numChannels) {
        lVar28 = 0x1f8;
        lVar25 = 0;
        do {
          pCVar8 = me->_channelData;
          bVar30 = false;
          if (pCVar8[lVar25].processed != 0) goto LAB_0010879f;
          pCVar2 = pCVar8 + lVar25;
          peVar10 = pCVar8[lVar25].chan;
          CVar5 = pCVar2->compression;
          if (CVar5 == UNKNOWN) {
            if ((pCVar2->_dctData)._size != 0) {
              sVar18 = (long)peVar10->bytes_per_element * (long)peVar10->width;
              uVar23 = 0;
              do {
                memcpy(pCVar2->planarUncBufferEnd,(pCVar2->_dctData)._rows[uVar23],sVar18);
                pCVar2->planarUncBufferEnd = pCVar2->planarUncBufferEnd + sVar18;
                uVar23 = uVar23 + 1;
              } while (uVar23 < (pCVar2->_dctData)._size);
            }
            __s[1] = __s[1] + pCVar2->planarUncSize;
LAB_00108782:
            pCVar2->processed = 1;
            bVar30 = false;
          }
          else {
            bVar30 = true;
            if (CVar5 == LOSSY_DCT) {
              toNonlinear = (uint16_t *)0x0;
              if (peVar10->p_linear == '\0') {
                toNonlinear = dwaCompressorToNonlinear;
              }
              LossyDctEncoder_base_construct
                        (&local_380,me->_dwaCompressionLevel / 100000.0,local_3c0,local_3b8,
                         toNonlinear,peVar10->width,peVar10->height);
              local_380._channel_encode_data_count = 1;
              local_380._channel_encode_data[0] = &pCVar2->_dctData;
              uVar15 = LossyDctEncoder_execute(me->alloc_fn,me->free_fn,&local_380);
              auVar3 = *(undefined1 (*) [16])(__s + 8);
              __s[8] = local_380._numAcComp + auVar3._0_8_;
              __s[9] = local_380._numDcComp + auVar3._8_8_;
              local_3c0 = local_3c0 + local_380._numAcComp * 2;
              local_3b8 = local_3b8 + local_380._numDcComp * 2;
              if (uVar15 != 0) {
                local_3e0._0_4_ = uVar15;
              }
              local_3e0 = (ulong)(uint)local_3e0;
              if (uVar15 == 0) goto LAB_00108782;
            }
            else {
              if (CVar5 == RLE) {
                if ((pCVar2->_dctData)._size != 0) {
                  uVar23 = 0;
                  do {
                    iVar29 = peVar10->width;
                    if (0 < iVar29) {
                      puVar26 = (pCVar2->_dctData)._rows[uVar23];
                      iVar14 = 0;
                      do {
                        if ('\0' < peVar10->bytes_per_element) {
                          lVar27 = 0;
                          do {
                            uVar4 = puVar26[lVar27];
                            puVar11 = *(uint8_t **)
                                       ((long)(pCVar8->_dctData)._dctData + lVar27 * 8 + lVar28);
                            *(uint8_t **)((long)(pCVar8->_dctData)._dctData + lVar27 * 8 + lVar28) =
                                 puVar11 + 1;
                            *puVar11 = uVar4;
                            lVar27 = lVar27 + 1;
                          } while (lVar27 < peVar10->bytes_per_element);
                          puVar26 = puVar26 + lVar27;
                        }
                        iVar14 = iVar14 + 1;
                        iVar29 = peVar10->width;
                      } while (iVar14 < iVar29);
                    }
                    __s[7] = __s[7] + (long)peVar10->bytes_per_element * (long)iVar29;
                    uVar23 = uVar23 + 1;
                  } while (uVar23 < (pCVar2->_dctData)._size);
                }
                goto LAB_00108782;
              }
              local_3e0 = 3;
            }
          }
LAB_0010879f:
          if (bVar30) break;
          lVar25 = lVar25 + 1;
          lVar28 = lVar28 + 0x240;
          bVar31 = lVar25 < me->_numChannels;
        } while (lVar25 < me->_numChannels);
      }
      if (bVar31) {
        return (uint)local_3e0;
      }
      sVar22 = __s[1];
      if (sVar22 != 0) {
        puVar26 = me->_planarUncBuffer[0];
        p_Var12 = me->_encode->context;
        sVar20 = exr_compress_max_buffer_size(sVar22);
        eVar13 = exr_compress_buffer(p_Var12,9,puVar26,sVar22,out,sVar20,(size_t *)&local_380);
        if (eVar13 != 0) {
          return eVar13;
        }
        out = (undefined8 *)((long)out + (long)local_380._toNonlinear);
        __s[2] = local_380._toNonlinear;
        local_3c8 = local_3c8 + (long)local_380._toNonlinear;
        uVar15 = 0;
      }
      uVar21 = __s[8];
      if (uVar21 != 0) {
        encbytes = __s + 3;
        if (me->_acCompression == DEFLATE) {
          puVar26 = me->_packedAcBuffer;
          p_Var12 = me->_encode->context;
          sVar22 = exr_compress_max_buffer_size(uVar21 * 2);
          uVar15 = exr_compress_buffer(p_Var12,9,puVar26,uVar21 * 2,out,sVar22,(size_t *)&local_380)
          ;
          uVar16 = uVar15;
          if (uVar15 == 0) {
            *encbytes = (uint64_t)local_380._toNonlinear;
            uVar16 = (uint)local_3e0;
          }
        }
        else {
          if (me->_acCompression != STATIC_HUFFMAN) {
            return 3;
          }
          uVar15 = internal_huf_compress
                             (encbytes,out,(long)__s + (local_388 - (long)out),
                              (uint16_t *)me->_packedAcBuffer,uVar21,me->_encode->scratch_buffer_1,
                              me->_encode->scratch_alloc_size_1);
          uVar16 = (uint)local_3e0;
          if ((uVar15 != 0) && (uVar16 = uVar15, uVar15 == 4)) {
            peVar24 = me->_encode;
            memcpy(peVar24->compressed_buffer,peVar24->packed_buffer,peVar24->packed_alloc_size);
            me->_encode->compressed_bytes = me->_encode->packed_alloc_size;
            uVar16 = 0;
          }
        }
        if (uVar15 != 0) {
          return uVar16;
        }
        out = (undefined8 *)((long)out + *encbytes);
        local_3c8 = local_3c8 + *encbytes;
        uVar15 = 0;
        local_3e0._0_4_ = uVar16;
      }
      if (__s[9] != 0) {
        sVar22 = __s[9] * 2;
        peVar24 = me->_encode;
        uVar15 = internal_encode_alloc_buffer
                           (peVar24,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar24->scratch_buffer_1,
                            &peVar24->scratch_alloc_size_1,sVar22);
        if (uVar15 == 0) {
          internal_zip_deconstruct_bytes
                    ((uint8_t *)me->_encode->scratch_buffer_1,me->_packedDcBuffer,sVar22);
          iVar29 = me->_zipLevel;
          p_Var12 = me->_encode->context;
          in = me->_encode->scratch_buffer_1;
          sVar20 = exr_compress_max_buffer_size(sVar22);
          uVar16 = exr_compress_buffer(p_Var12,iVar29,in,sVar22,out,sVar20,(size_t *)&local_380);
          uVar15 = 0;
          if (uVar16 == 0) {
            __s[4] = local_380._toNonlinear;
            out = (undefined8 *)((long)out + (long)local_380._toNonlinear);
            local_3c8 = local_3c8 + (long)local_380._toNonlinear;
            bVar31 = true;
          }
          else {
            bVar31 = false;
            local_3e0._0_4_ = uVar16;
            uVar15 = uVar16;
          }
        }
        else {
          bVar31 = false;
          local_3e0._0_4_ = uVar15;
        }
        if (!bVar31) {
          return (uint)local_3e0;
        }
      }
      if (__s[7] != 0) {
        uVar21 = internal_rle_compress
                           (me->_rleBuffer,me->_rleBufferSize,me->_planarUncBuffer[2],__s[7]);
        __s[6] = uVar21;
        puVar26 = me->_rleBuffer;
        p_Var12 = me->_encode->context;
        sVar22 = exr_compress_max_buffer_size(uVar21);
        eVar13 = exr_compress_buffer(p_Var12,9,puVar26,uVar21,out,sVar22,(size_t *)&local_380);
        if (eVar13 != 0) {
          return eVar13;
        }
        __s[5] = local_380._toNonlinear;
        out = (undefined8 *)((long)out + (long)local_380._toNonlinear);
        local_3c8 = local_3c8 + (long)local_380._toNonlinear;
        uVar15 = 0;
      }
      peVar24 = me->_encode;
      if (local_3c8 != (long)out - (long)peVar24->compressed_buffer) {
        return 0x17;
      }
      if (peVar24->packed_bytes <= local_3c8) {
        memcpy(peVar24->compressed_buffer,peVar24->packed_buffer,peVar24->packed_bytes);
        peVar24 = me->_encode;
        local_3c8 = peVar24->packed_bytes;
      }
      peVar24->compressed_bytes = local_3c8;
      return uVar15;
    }
  }
  return 1;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t*    sizes;
    size_t       outBufferSize = 0;
    uint64_t     dataBytes, nWritten = 0;
    uint64_t     nAvail;
    uint64_t     fileVersion = 2;
    uint64_t*    version;
    uint64_t*    unknownUncompressedSize;
    uint64_t*    unknownCompressedSize;
    uint64_t*    acCompressedSize;
    uint64_t*    dcCompressedSize;
    uint64_t*    rleCompressedSize;
    uint64_t*    rleUncompressedSize;
    uint64_t*    rleRawSize;

    uint64_t* totalAcUncompressedCount;
    uint64_t* totalDcUncompressedCount;

    uint64_t* acCompression;
    uint8_t*  packedAcEnd;
    uint8_t*  packedDcEnd;
    uint8_t*  outDataPtr;
    uint8_t*  inDataPtr;

    // Starting with DWA v2, we write the channel
    // classification rules into the file
    me->_channelRules     = sDefaultChannelRules;
    me->_channelRuleCount = sizeof (sDefaultChannelRules) / sizeof (Classifier);

    rv = DwaCompressor_initializeBuffers (me, &outBufferSize);

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail = outBufferSize;
    sizes  = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    version                 = OBIDX (VERSION);
    unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    rleRawSize              = OBIDX (RLE_RAW_SIZE);

    totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    acCompression = OBIDX (AC_COMPRESSION);
    packedAcEnd   = NULL;
    packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    outDataPtr = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (int c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    inDataPtr = me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (int c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (
                me->alloc_fn, me->free_fn, &(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (int csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS)
            rv = LossyDctEncoder_execute (me->alloc_fn, me->free_fn, &enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (int chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (
                            me->alloc_fn, me->free_fn, &enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += (uint64_t) pchan->width *
                                   (uint64_t) pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize = (size_t) pchan->width *
                                          (size_t) pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            case NUM_COMPRESSOR_SCHEMES:
            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS) return rv;

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    me->_encode->context,
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS) return rv;

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            me->_encode->scratch_buffer_1, me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_encode->context,
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        size_t compBytes;
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}